

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExporterT.hh
# Opt level: O3

Vec4ui __thiscall
OpenMesh::IO::ExporterT<OpenMesh::PolyMesh_ArrayKernelT<OpenMesh::DefaultTraits>_>::colorAi
          (ExporterT<OpenMesh::PolyMesh_ArrayKernelT<OpenMesh::DefaultTraits>_> *this,FaceHandle _fh
          )

{
  long lVar1;
  long lVar2;
  Vec4ui VVar3;
  
  lVar2 = (long)(this->mesh_->super_Mesh).
                super_AttribKernelT<OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,_false>,_OpenMesh::PolyConnectivity>
                .face_colors_.super_BasePropHandleT<OpenMesh::VectorT<unsigned_char,_3>_>.
                super_BaseHandle.idx_;
  if (-1 < lVar2) {
    lVar2 = *(long *)(*(long *)(*(long *)&(this->mesh_->super_Mesh).
                                          super_AttribKernelT<OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,_false>,_OpenMesh::PolyConnectivity>
                                          .super_PolyConnectivity.field_0x70 + lVar2 * 8) + 0x30);
    lVar1 = (long)(int)_fh.super_BaseHandle.idx_ * 3;
    VVar3.values_._M_elems._0_8_ =
         (ulong)*(byte *)(lVar2 + 1 + lVar1) << 0x20 | (ulong)*(byte *)(lVar2 + lVar1);
    VVar3.values_._M_elems._8_8_ = (ulong)*(byte *)(lVar2 + 2 + lVar1) | 0xff00000000;
    return (Vec4ui)VVar3.values_._M_elems;
  }
  return (container)ZEXT816(0);
}

Assistant:

Vec4ui  colorAi(FaceHandle _fh)   const override
  {
    return (mesh_.has_face_colors()
            ? color_cast<Vec4ui>(mesh_.color(_fh))
            : Vec4ui(0, 0, 0, 0));
  }